

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

void __thiscall
gl4cts::MultiBind::Buffer::InitData
          (Buffer *this,Context *context,GLenum target,GLenum usage,GLsizeiptr size,GLvoid *data)

{
  int iVar1;
  undefined4 extraout_var;
  Functions *gl;
  
  Release(this);
  this->m_context = context;
  this->m_target = target;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  Generate(gl,&this->m_id);
  Bind(gl,this->m_id,this->m_target);
  Data(gl,this->m_target,usage,size,data);
  return;
}

Assistant:

void Buffer::InitData(deqp::Context& context, glw::GLenum target, glw::GLenum usage, glw::GLsizeiptr size,
					  const glw::GLvoid* data)
{
	Init(context);

	m_target = target;

	const Functions& gl = m_context->getRenderContext().getFunctions();

	Generate(gl, m_id);
	Bind(gl, m_id, m_target);
	Data(gl, m_target, usage, size, data);
}